

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O1

int h264_residual_cabac(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,
                       h264_macroblock *mb,int32_t *block,int cat,int idx,int start,int end,
                       int maxnumcoeff,int coded)

{
  h264_macroblock *phVar1;
  h264_cabac_context *cabac_00;
  bitstream *str_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint32_t *val;
  ulong uVar5;
  ulong uVar6;
  int idx_00;
  long lVar7;
  uint32_t *val_00;
  bool bVar8;
  uint32_t coded_block_flag;
  int32_t cam1;
  uint32_t significant_coeff_flag [64];
  uint32_t last_significant_coeff_flag [64];
  uint32_t local_264;
  h264_macroblock *local_260;
  uint local_254;
  uint local_250;
  uint local_24c;
  h264_cabac_context *local_248;
  bitstream *local_240;
  uint32_t local_238 [64];
  uint32_t local_138 [66];
  
  local_264 = 0;
  if (0 < maxnumcoeff) {
    uVar5 = 0;
    do {
      if (block[uVar5] != 0) {
        local_264 = 1;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)maxnumcoeff != uVar5);
  }
  local_260 = mb;
  local_248 = cabac;
  if (coded == 0) {
    iVar2 = vs_infer(str,&local_264,0);
  }
  else if ((maxnumcoeff == 0x40) && (slice->chroma_array_type != 3)) {
    iVar2 = vs_infer(str,&local_264,1);
  }
  else {
    iVar2 = h264_coded_block_flag(str,cabac,cat,idx,&local_264);
  }
  phVar1 = local_260;
  if (iVar2 != 0) {
    return 1;
  }
  switch(cat) {
  case 0:
    local_260->coded_block_flag[0][0x10] = local_264;
    break;
  case 1:
  case 2:
    goto LAB_00104e2c;
  case 3:
    local_260->coded_block_flag[idx + 1][0x10] = local_264;
    break;
  case 4:
    local_260->coded_block_flag[(idx >> 3) + 1][idx & 7] = local_264;
    break;
  case 5:
    local_260->coded_block_flag[0][idx * 4] = local_264;
    local_260->coded_block_flag[0][idx * 4 + 1] = local_264;
    local_260->coded_block_flag[0][idx * 4 + 2] = local_264;
    idx = idx * 4 + 3;
LAB_00104e2c:
    local_260->coded_block_flag[0][idx] = local_264;
    break;
  case 6:
    local_260->coded_block_flag[1][0x10] = local_264;
    break;
  case 7:
  case 8:
    goto LAB_00104d9c;
  case 9:
    local_260->coded_block_flag[1][idx * 4] = local_264;
    local_260->coded_block_flag[1][idx * 4 + 1] = local_264;
    local_260->coded_block_flag[1][idx * 4 + 2] = local_264;
    idx = idx * 4 + 3;
LAB_00104d9c:
    local_260->coded_block_flag[1][idx] = local_264;
    break;
  case 10:
    local_260->coded_block_flag[2][0x10] = local_264;
    break;
  case 0xb:
  case 0xc:
    goto LAB_00104e90;
  case 0xd:
    local_260->coded_block_flag[2][idx * 4] = local_264;
    local_260->coded_block_flag[2][idx * 4 + 1] = local_264;
    local_260->coded_block_flag[2][idx * 4 + 2] = local_264;
    idx = idx * 4 + 3;
LAB_00104e90:
    local_260->coded_block_flag[2][idx] = local_264;
    break;
  default:
    abort();
  }
  if (local_264 == 0) {
    if (0 < maxnumcoeff) {
      uVar5 = 0;
      do {
        if (str->dir == VS_ENCODE) {
          if (block[uVar5] != 0) {
            h264_residual_cabac_cold_2();
            return 1;
          }
        }
        else {
          block[uVar5] = 0;
        }
        uVar5 = uVar5 + 1;
      } while ((uint)maxnumcoeff != uVar5);
    }
  }
  else {
    local_260 = (h264_macroblock *)CONCAT44(local_260._4_4_,cat);
    local_254 = 1;
    if (phVar1->mb_field_decoding_flag == 0) {
      local_254 = (uint)(local_248->slice->field_pic_flag != 0);
    }
    memset(local_238,0,0x100);
    memset(local_138,0,0x100);
    local_240 = str;
    if (str->dir == VS_ENCODE) {
      bVar8 = 0 < maxnumcoeff;
      if (maxnumcoeff < 1) {
        iVar2 = -1;
      }
      else {
        uVar5 = 0xffffffff;
        uVar6 = 0;
        do {
          if (block[uVar6] == 0) {
            local_238[uVar6] = 0;
          }
          else {
            if (((long)uVar6 < (long)start) || ((long)end < (long)uVar6)) {
              h264_residual_cabac_cold_1();
              goto LAB_00104fcc;
            }
            local_238[uVar6] = 1;
            uVar5 = uVar6 & 0xffffffff;
          }
          iVar2 = (int)uVar5;
          local_138[uVar6] = 0;
          uVar6 = uVar6 + 1;
          bVar8 = uVar6 < (uint)maxnumcoeff;
        } while (uVar6 != (uint)maxnumcoeff);
      }
      if (iVar2 == -1) {
        __assert_fail("last != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/vstream/h264_residual.c"
                      ,0xce,
                      "int h264_residual_cabac(struct bitstream *, struct h264_cabac_context *, struct h264_slice *, struct h264_macroblock *, int32_t *, int, int, int, int, int, int)"
                     );
      }
      local_138[iVar2] = 1;
LAB_00104fcc:
      if (bVar8) {
        return 1;
      }
    }
    if (start < end) {
      iVar2 = end + 1;
      lVar7 = (long)start;
      val = local_238 + lVar7;
      val_00 = local_138 + lVar7;
      do {
        idx_00 = (int)lVar7;
        iVar3 = h264_significant_coeff_flag
                          (local_240,local_248,local_254,(int)local_260,idx_00,0,val);
        if (iVar3 != 0) {
          return 1;
        }
        iVar3 = iVar2;
        if (*val != 0) {
          iVar3 = h264_significant_coeff_flag
                            (local_240,local_248,local_254,(int)local_260,idx_00,1,val_00);
          if (iVar3 != 0) {
            return 1;
          }
          iVar3 = idx_00 + 1;
          if (*val_00 == 0) {
            iVar3 = iVar2;
          }
        }
        iVar2 = iVar3;
        lVar7 = lVar7 + 1;
        end = iVar2 + -1;
        val = val + 1;
        val_00 = val_00 + 1;
      } while (lVar7 < end);
    }
    str_00 = local_240;
    local_238[end] = 1;
    if (0 < maxnumcoeff && local_240->dir == VS_DECODE) {
      memset(block,0,(ulong)(uint)maxnumcoeff << 2);
    }
    cabac_00 = local_248;
    if (start <= end) {
      lVar7 = (long)end + 1;
      local_254 = 0;
      iVar2 = 0;
      do {
        if (local_238[lVar7 + -1] != 0) {
          local_250 = block[lVar7 + -1];
          local_24c = -local_250;
          if (0 < (int)local_250) {
            local_24c = local_250;
          }
          local_24c = local_24c - 1;
          local_250 = local_250 >> 0x1f;
          iVar3 = h264_coeff_abs_level_minus1
                            (str_00,cabac_00,(int)local_260,iVar2,local_254,(int32_t *)&local_24c);
          if ((iVar3 == 0) && (iVar3 = h264_cabac_bypass(str_00,cabac_00,&local_250), iVar3 == 0)) {
            iVar2 = iVar2 + (uint)(local_24c == 0);
            local_254 = local_254 + (local_24c != 0);
            bVar8 = true;
            if (str_00->dir == VS_DECODE) {
              uVar4 = ~local_24c;
              if (local_250 == 0) {
                uVar4 = local_24c + 1;
              }
              block[lVar7 + -1] = uVar4;
            }
          }
          else {
            bVar8 = false;
          }
          if (!bVar8) {
            return 1;
          }
        }
        lVar7 = lVar7 + -1;
      } while (start < lVar7);
    }
  }
  return 0;
}

Assistant:

int h264_residual_cabac(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb, int32_t *block, int cat, int idx, int start, int end, int maxnumcoeff, int coded) {
	int i;
	uint32_t coded_block_flag = 0;
	for (i = 0 ; i < maxnumcoeff; i++)
		if (block[i])
			coded_block_flag = 1;
	if (coded) {
		if (maxnumcoeff != 64 || slice->chroma_array_type == 3) {
			if (h264_coded_block_flag(str, cabac, cat, idx, &coded_block_flag)) return 1;
		} else {
			if (vs_infer(str, &coded_block_flag, 1)) return 1;
		}
	} else {
		if (vs_infer(str, &coded_block_flag, 0)) return 1;
	}
	switch (cat) {
		case H264_CTXBLOCKCAT_LUMA_DC:
			mb->coded_block_flag[0][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
			mb->coded_block_flag[0][idx] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_LUMA_8X8:
			mb->coded_block_flag[0][idx * 4 + 0] = coded_block_flag;
			mb->coded_block_flag[0][idx * 4 + 1] = coded_block_flag;
			mb->coded_block_flag[0][idx * 4 + 2] = coded_block_flag;
			mb->coded_block_flag[0][idx * 4 + 3] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CB_DC:
			mb->coded_block_flag[1][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
			mb->coded_block_flag[1][idx] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CB_8X8:
			mb->coded_block_flag[1][idx * 4 + 0] = coded_block_flag;
			mb->coded_block_flag[1][idx * 4 + 1] = coded_block_flag;
			mb->coded_block_flag[1][idx * 4 + 2] = coded_block_flag;
			mb->coded_block_flag[1][idx * 4 + 3] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CR_DC:
			mb->coded_block_flag[2][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
			mb->coded_block_flag[2][idx] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CR_8X8:
			mb->coded_block_flag[2][idx * 4 + 0] = coded_block_flag;
			mb->coded_block_flag[2][idx * 4 + 1] = coded_block_flag;
			mb->coded_block_flag[2][idx * 4 + 2] = coded_block_flag;
			mb->coded_block_flag[2][idx * 4 + 3] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CHROMA_DC:
			mb->coded_block_flag[idx+1][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			mb->coded_block_flag[(idx >> 3)+1][idx & 7] = coded_block_flag;
			break;
		default:
			abort();
	}
	if (coded_block_flag) {
		int field = mb->mb_field_decoding_flag || cabac->slice->field_pic_flag;
		uint32_t significant_coeff_flag[64] = { 0 };
		uint32_t last_significant_coeff_flag[64] = { 0 };
		if (str->dir == VS_ENCODE) {
			int last = -1;
			for (i = 0; i < maxnumcoeff; i++) {
				if (block[i]) {
					if (i < start || i > end) {
						fprintf (stderr, "Non-zero coordinate outside start..end!\n");
						return 1;
					}
					significant_coeff_flag[i] = 1;
					last = i;
				} else {
					significant_coeff_flag[i] = 0;
				}
				last_significant_coeff_flag[i] = 0;
			}
			assert(last != -1);
			last_significant_coeff_flag[last] = 1;
		}
		int numcoeff = end + 1;
		for (i = start; i < numcoeff - 1; i++) {
			if (h264_significant_coeff_flag(str, cabac, field, cat, i, 0, &significant_coeff_flag[i])) return 1;
			if (significant_coeff_flag[i]) {
				if (h264_significant_coeff_flag(str, cabac, field, cat, i, 1, &last_significant_coeff_flag[i])) return 1;
				if (last_significant_coeff_flag[i]) {
					numcoeff = i + 1;
				}
			}
		}
		significant_coeff_flag[numcoeff-1] = 1;
		if (str->dir == VS_DECODE) {
			for (i = 0; i < maxnumcoeff; i++)
				block[i] = 0;
		}
		int num1 = 0, numgt1 = 0;
		for (i = numcoeff - 1; i >= start; i--) {
			if (significant_coeff_flag[i]) {
				int32_t cam1 = abs(block[i]) - 1;
				uint32_t s = block[i] < 0;
				if (h264_coeff_abs_level_minus1(str, cabac, cat, num1, numgt1, &cam1)) return 1;
				if (h264_cabac_bypass(str, cabac, &s)) return 1;
				if (cam1)
					numgt1++;
				else
					num1++;
				if (str->dir == VS_DECODE)
					block[i] = (s ? -(cam1 + 1) : cam1 + 1);
			}
		}
	} else {
		for (i = 0; i < maxnumcoeff; i++) {
			if (str->dir == VS_ENCODE) {
				if (block[i]) {
					fprintf(stderr, "Non-zero coordinate in a skipped block!\n");
					return 1;
				}
			} else {
				block[i] = 0;
			}
		}
	}
	return 0;
}